

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_xc_ksdt.c
# Opt level: O0

void T_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar2;
  lda_xc_ksdt_params *params;
  
  pdVar1 = (double *)in_RDI->params;
  dVar2 = get_ext_param(in_RDI,in_RSI,0);
  *pdVar1 = dVar2;
  if (*pdVar1 <= 1e-08 && *pdVar1 != 1e-08) {
    *pdVar1 = 1e-08;
  }
  return;
}

Assistant:

static void
T_set_ext_params(xc_func_type *p, const double *ext_params)
{
  lda_xc_ksdt_params *params;

  assert(p != NULL && p->params != NULL);
  params = (lda_xc_ksdt_params *) (p->params);

  /* the temperature is in units of k_B */
  params->T = get_ext_param(p, ext_params, 0);
  if(params->T < 1e-8) params->T = 1e-8;
}